

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManSimCollect_rec(Gia_Man_t *pGia,Gia_Obj_t *pObj,Vec_Int_t *vVec)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vVec_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ObjToLit(pGia,pObj);
  Vec_IntPush(vVec,iVar1);
  iVar1 = Gia_IsComplement(pObj);
  if ((iVar1 == 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                    ,0x3c,"void Gia_ManSimCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pGVar2 = Gia_ObjChild0(pObj);
    Gia_ManSimCollect_rec(pGia,pGVar2,vVec);
    pGVar2 = Gia_ObjChild1(pObj);
    Gia_ManSimCollect_rec(pGia,pGVar2,vVec);
  }
  return;
}

Assistant:

void Gia_ManSimCollect_rec( Gia_Man_t * pGia, Gia_Obj_t * pObj, Vec_Int_t * vVec )
{
    Vec_IntPush( vVec, Gia_ObjToLit(pGia, pObj) );
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManSimCollect_rec( pGia, Gia_ObjChild0(pObj), vVec );
    Gia_ManSimCollect_rec( pGia, Gia_ObjChild1(pObj), vVec );
}